

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aws_command_runner_test.cc
# Opt level: O2

void __thiscall
AwsCommandRunner_Remove_Test::~AwsCommandRunner_Remove_Test(AwsCommandRunner_Remove_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(AwsCommandRunner, Remove) {
  MockCommandRunner command_runner;
  MultipleCommandRunner multiple_command_runner(&command_runner);
  EXPECT_CALL(command_runner, RunCommand(std::vector<std::string>({
                                  "aws", "s3", "rm", "s3://bucket/foo",
                              })))
      .Times(1);
  EXPECT_CALL(command_runner,
              RunCommand(std::vector<std::string>({
                  "aws", "s3", "rm", "--recursive", "s3://bucket/foo",
              })))
      .Times(1);
  EXPECT_CALL(command_runner, Finished()).WillRepeatedly(Return(true));
  EXPECT_CALL(command_runner, PreviousCommandFailed())
      .WillRepeatedly(Return(false));

  AwsCommandRunner aws_command_runner(&multiple_command_runner, "/tmp/",
                                      "bucket", {});
  aws_command_runner.Remove("/tmp/foo");

  ASSERT_FALSE(aws_command_runner.Finished());
  ASSERT_FALSE(aws_command_runner.PreviousCommandFailed());
  ASSERT_FALSE(aws_command_runner.Finished());
  ASSERT_FALSE(aws_command_runner.PreviousCommandFailed());
  ASSERT_TRUE(aws_command_runner.Finished());
  ASSERT_FALSE(aws_command_runner.PreviousCommandFailed());
}